

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.h
# Opt level: O0

flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>_>_>
* upb::generator::GetUpbFields<upb::MessageDefPtr>
            (flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>_>_>
             *__return_storage_ptr__,MessageDefPtr *msg_def)

{
  bool bVar1;
  CType CVar2;
  FieldIter FVar3;
  FieldIter rhs;
  FieldIter lhs;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>_>_>::iterator,_bool>
  local_128;
  FieldClass local_10c;
  char *local_108;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>_>_>::iterator,_bool>
  local_100;
  FieldClass local_e4;
  char *local_e0;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>_>_>::iterator,_bool>
  local_d8;
  FieldClass local_bc;
  char *local_b8;
  FieldDefPtr local_b0;
  FieldDefPtr field;
  FieldIter __end0;
  undefined1 auStack_50 [8];
  FieldIter __begin0;
  FieldAccessor local_30;
  FieldAccessor *local_28;
  FieldAccessor *__range2;
  MessageDefPtr *local_18;
  MessageDefPtr *msg_def_local;
  flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>_>_>
  *fields;
  
  __range2._7_1_ = 0;
  local_18 = msg_def;
  msg_def_local = (MessageDefPtr *)__return_storage_ptr__;
  absl::lts_20250127::
  flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>_>_>
  ::flat_hash_map(__return_storage_ptr__);
  local_30 = MessageDefPtr::fields(local_18);
  local_28 = &local_30;
  FVar3 = MessageDefPtr::FieldAccessor::begin(local_28);
  auStack_50 = (undefined1  [8])FVar3.m_;
  __begin0.m_._0_4_ = FVar3.i_;
  FVar3 = MessageDefPtr::FieldAccessor::end(local_28);
  while (lhs.i_ = (int)__begin0.m_, lhs.m_ = (upb_MessageDef *)auStack_50, rhs._12_4_ = 0,
        rhs.m_ = (upb_MessageDef *)SUB128(FVar3._0_12_,0), rhs.i_ = SUB124(FVar3._0_12_,8),
        lhs._12_4_ = 0, field.ptr_ = (upb_FieldDef *)FVar3.m_, bVar1 = upb::operator!=(lhs,rhs),
        bVar1) {
    local_b0 = MessageDefPtr::FieldIter::operator*((FieldIter *)auStack_50);
    bVar1 = FieldDefPtr::IsSequence(&local_b0);
    if ((bVar1) || (bVar1 = FieldDefPtr::IsMap(&local_b0), bVar1)) {
      local_b8 = FieldDefPtr::name(&local_b0);
      local_bc = kContainerField;
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>_>_>
      ::emplace<const_char_*,_upb::generator::FieldClass,_0>
                (&local_d8,
                 (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>_>_>
                  *)__return_storage_ptr__,&local_b8,&local_bc);
    }
    else {
      CVar2 = FieldDefPtr::ctype(&local_b0);
      if (CVar2 == kUpb_CType_String) {
        local_e0 = FieldDefPtr::name(&local_b0);
        local_e4 = kStringField;
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>_>_>
        ::emplace<const_char_*,_upb::generator::FieldClass,_0>
                  (&local_100,
                   (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>_>_>
                    *)__return_storage_ptr__,&local_e0,&local_e4);
      }
      else {
        local_108 = FieldDefPtr::name(&local_b0);
        local_10c = kOtherField;
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>_>_>
        ::emplace<const_char_*,_upb::generator::FieldClass,_0>
                  (&local_128,
                   (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>_>_>
                    *)__return_storage_ptr__,&local_108,&local_10c);
      }
    }
    MessageDefPtr::FieldIter::operator++((FieldIter *)auStack_50);
  }
  return __return_storage_ptr__;
}

Assistant:

absl::flat_hash_map<std::string, FieldClass> GetUpbFields(const T& msg_def) {
  absl::flat_hash_map<std::string, FieldClass> fields;
  for (const auto field : msg_def.fields()) {
    if (field.IsSequence() || field.IsMap()) {
      fields.emplace(field.name(), kContainerField);
    } else if (field.ctype() == decltype(field)::CType::kUpb_CType_String) {
      fields.emplace(field.name(), kStringField);
    } else {
      fields.emplace(field.name(), kOtherField);
    }
  }
  return fields;
}